

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O3

void draw_search(Fl_Color col)

{
  Fl_Color FVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,col);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd999999999999a,0x3fc0a3d70a3d70a4);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbff0000000000000,0x3fe75c28f5c28f5c);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe75c28f5c28f5c,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfc0a3d70a3d70a4,0x3fd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  FVar1 = fl_color_average(col,0x38,0.67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[5])(fl_graphics_driver,0,3,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1e])
            (0x3fc999999999999a,0xbfc999999999999a,0x3fe3333333333333);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[5])(fl_graphics_driver,0,1,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd999999999999a,0x3fc0a3d70a3d70a4);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbff0000000000000,0x3fe75c28f5c28f5c);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe75c28f5c28f5c,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfc0a3d70a3d70a4,0x3fd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  return;
}

Assistant:

static void draw_search(Fl_Color col) 
{
  fl_color(col);
  BP; vv(-.4, .13); vv(-1.0, .73); vv(-.73, 1.0); vv(-.13, .4); EP;
  set_outline_color(col);
  fl_line_style(FL_SOLID, 3, 0);
  BC; fl_circle(.2, -.2, .6); EC;
  fl_line_style(FL_SOLID, 1, 0);
  BC; vv(-.4, .13); vv(-1.0, .73); vv(-.73, 1.0); vv(-.13, .4); EC;
}